

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branching.cpp
# Opt level: O2

DecInfo * __thiscall PriorityBranchGroup::branch(PriorityBranchGroup *this)

{
  Tint *this_00;
  vec<int> *pvVar1;
  VarBranch VVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Branching *pBVar6;
  uint i;
  ulong uVar7;
  double extraout_XMM0_Qa;
  uniform_int_distribution<int> rnd_move;
  uniform_int_distribution<int> local_40;
  double local_38;
  
  lVar5 = (long)(this->super_BranchGroup).cur.v;
  if ((-1 < lVar5) &&
     (iVar3 = (**(this->annotations).data[lVar5]->_vptr_Branching)(), (char)iVar3 == '\0')) {
    pBVar6 = (this->annotations).data[(uint)(this->super_BranchGroup).cur.v];
LAB_00192d0c:
    iVar3 = (*pBVar6->_vptr_Branching[2])();
    return (DecInfo *)CONCAT44(extraout_var,iVar3);
  }
  this_00 = &(this->super_BranchGroup).cur;
  VVar2 = (this->super_BranchGroup).var_branch;
  if (VVar2 == VAR_RANDOM) {
    pvVar1 = &(this->super_BranchGroup).moves;
    if ((this->super_BranchGroup).moves.data != (int *)0x0) {
      pvVar1->sz = 0;
    }
    for (uVar7 = 0; uVar7 < (this->annotations).sz; uVar7 = uVar7 + 1) {
      iVar3 = (**(this->annotations).data[uVar7]->_vptr_Branching)();
      if ((char)iVar3 == '\0') {
        local_40._M_param._M_a = (int)uVar7;
        vec<int>::push(pvVar1,(int *)&local_40);
      }
    }
    if (pvVar1->sz != 0) {
      local_40._M_param._M_b = pvVar1->sz - 1;
      local_40._M_param._M_a = 0;
      uVar4 = std::uniform_int_distribution<int>::operator()(&local_40,&engine.rnd);
      uVar4 = (this->super_BranchGroup).moves.data[uVar4];
      if ((this->super_BranchGroup).terminal == false) {
        Tint::operator=(this_00,uVar4);
      }
      pBVar6 = (this->annotations).data[uVar4];
LAB_00192d40:
      iVar3 = (*pBVar6->_vptr_Branching[2])();
      return (DecInfo *)CONCAT44(extraout_var_00,iVar3);
    }
  }
  else if (VVar2 == VAR_INORDER) {
    for (uVar7 = 0; uVar4 = (this->annotations).sz, uVar7 < uVar4; uVar7 = uVar7 + 1) {
      iVar3 = (**(this->annotations).data[uVar7]->_vptr_Branching)();
      if ((char)iVar3 == '\0') {
        uVar4 = (this->annotations).sz;
        break;
      }
    }
    if (uVar4 != (uint)uVar7) {
      if ((this->super_BranchGroup).terminal == false) {
        Tint::operator=(this_00,(uint)uVar7);
      }
      pBVar6 = (this->annotations).data[uVar7];
      goto LAB_00192d0c;
    }
  }
  else {
    pvVar1 = &(this->super_BranchGroup).moves;
    if ((this->super_BranchGroup).moves.data != (int *)0x0) {
      pvVar1->sz = 0;
    }
    local_38 = -1e+100;
    for (uVar7 = 0; uVar7 < (this->annotations).sz; uVar7 = uVar7 + 1) {
      iVar3 = (**(this->annotations).data[uVar7]->_vptr_Branching)();
      if (((char)iVar3 == '\0') &&
         (pBVar6 = (this->super_BranchGroup).x.data[uVar7],
         (*pBVar6->_vptr_Branching[1])(pBVar6,(ulong)(this->super_BranchGroup).var_branch),
         local_38 <= extraout_XMM0_Qa)) {
        if ((local_38 < extraout_XMM0_Qa) &&
           (local_38 = extraout_XMM0_Qa, (this->super_BranchGroup).moves.data != (int *)0x0)) {
          pvVar1->sz = 0;
        }
        local_40._M_param._M_a = (int)uVar7;
        vec<int>::push(pvVar1,(int *)&local_40);
      }
    }
    if (pvVar1->sz != 0) {
      if (so.branch_random == true) {
        local_40._M_param._M_b = pvVar1->sz - 1;
        local_40._M_param._M_a = 0;
        uVar4 = std::uniform_int_distribution<int>::operator()(&local_40,&engine.rnd);
        uVar4 = (this->super_BranchGroup).moves.data[uVar4];
      }
      else {
        uVar4 = *(this->super_BranchGroup).moves.data;
      }
      if ((this->super_BranchGroup).terminal == false) {
        Tint::operator=(this_00,uVar4);
      }
      pBVar6 = (this->annotations).data[uVar4];
      goto LAB_00192d40;
    }
  }
  return (DecInfo *)0x0;
}

Assistant:

DecInfo* PriorityBranchGroup::branch() {
	// Check whether the current branching group has finished,
	// if not yet then continue search with this one
	if (cur >= 0 && !annotations[cur]->finished()) {
		return annotations[cur]->branch();
	}

	/* Select the next branching group */

	// Special case of input order selection
	if (var_branch == VAR_INORDER) {
		unsigned int i = 0;
		while (i < annotations.size() && annotations[i]->finished()) {
			i++;
		}
		if (i == annotations.size()) {
			return nullptr;
		}
		if (!terminal) {
			cur = i;
		}
		return annotations[i]->branch();
	}
	// Special case of random order selection
	if (var_branch == VAR_RANDOM) {
		moves.clear();
		for (unsigned int i = 0; i < annotations.size(); i++) {
			if (!annotations[i]->finished()) {
				moves.push(i);
			}
		}
		if (moves.size() == 0) {
			return nullptr;
		}
		std::uniform_int_distribution<int> rnd_move(0, moves.size() - 1);
		const int best_i = moves[rnd_move(engine.rnd)];
		if (!terminal) {
			cur = best_i;
		}
		return annotations[best_i]->branch();
	}

	// All other selection strategies
	double best = -1e100;
	moves.clear();
	for (unsigned int i = 0; i < annotations.size(); i++) {
		if (annotations[i]->finished()) {
			continue;
		}
		const double s = x[i]->getScore(var_branch);
		if (s >= best) {
			if (s > best) {
				best = s;
				moves.clear();
			}
			moves.push(i);
		}
	}
	if (moves.size() == 0) {
		return nullptr;
	}
	int best_i = moves[0];
	// Special case of random selection of best moves
	if (so.branch_random) {
		std::uniform_int_distribution<int> rnd_move(0, moves.size() - 1);
		best_i = moves[rnd_move(engine.rnd)];
	}

	if (!terminal) {
		cur = best_i;
	}
	return annotations[best_i]->branch();
}